

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AllocateAlignedFallback
          (SerialArena *this,size_t n)

{
  Block *pBVar1;
  char *pcVar2;
  void *pvVar3;
  
  pBVar1 = this->head_;
  pBVar1->pos_ = (size_t)(this->ptr_ + (pBVar1->size_ - (long)this->limit_));
  pBVar1 = NewBlock(this->arena_,pBVar1,n);
  this->head_ = pBVar1;
  pcVar2 = Block::Pointer(pBVar1,pBVar1->pos_);
  this->ptr_ = pcVar2;
  pcVar2 = Block::Pointer(this->head_,this->head_->size_);
  this->limit_ = pcVar2;
  pvVar3 = AllocateAligned(this,n);
  return pvVar3;
}

Assistant:

PROTOBUF_NOINLINE
void* ArenaImpl::SerialArena::AllocateAlignedFallback(size_t n) {
  // Sync back to current's pos.
  head_->set_pos(head_->size() - (limit_ - ptr_));

  head_ = arena_->NewBlock(head_, n);
  ptr_ = head_->Pointer(head_->pos());
  limit_ = head_->Pointer(head_->size());

#ifdef ADDRESS_SANITIZER
  ASAN_POISON_MEMORY_REGION(ptr_, limit_ - ptr_);
#endif  // ADDRESS_SANITIZER

  return AllocateAligned(n);
}